

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

VariablePairPtr __thiscall libcellml::Annotator::connection(Annotator *this,string *id,size_t index)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  VariablePairPtr VVar1;
  shared_ptr<libcellml::AnyCellmlElement> local_38;
  size_t index_local;
  string *id_local;
  Annotator *this_local;
  
  index_local = index;
  id_local = id;
  this_local = this;
  item((Annotator *)&local_38,id,index);
  std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&local_38);
  AnyCellmlElement::variablePair((AnyCellmlElement *)this);
  std::shared_ptr<libcellml::AnyCellmlElement>::~shared_ptr(&local_38);
  VVar1.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  VVar1.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VariablePairPtr)
         VVar1.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VariablePairPtr Annotator::connection(const std::string &id, size_t index)
{
    return item(id, index)->variablePair();
}